

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

target_ulong helper_cmpb_ppc64(target_ulong rs,target_ulong rb)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0xff;
  iVar3 = 8;
  uVar1 = 0;
  do {
    uVar4 = 0;
    if ((uVar2 & (rs ^ rb)) == 0) {
      uVar4 = uVar2;
    }
    uVar1 = uVar1 | uVar4;
    uVar2 = uVar2 << 8;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return uVar1;
}

Assistant:

target_ulong helper_cmpb(target_ulong rs, target_ulong rb)
{
    target_ulong mask = 0xff;
    target_ulong ra = 0;
    int i;

    for (i = 0; i < sizeof(target_ulong); i++) {
        if ((rs & mask) == (rb & mask)) {
            ra |= mask;
        }
        mask <<= 8;
    }
    return ra;
}